

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

Bool prvTidynodeHasText(TidyDocImpl *doc,Node *node)

{
  Lexer *pLVar1;
  Bool BVar2;
  Lexer *lexer;
  uint ix;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if ((doc != (TidyDocImpl *)0x0) && (node != (Node *)0x0)) {
    pLVar1 = doc->lexer;
    for (lexer._4_4_ = node->start; lexer._4_4_ < node->end; lexer._4_4_ = lexer._4_4_ + 1) {
      BVar2 = prvTidyIsWhite((int)pLVar1->lexbuf[lexer._4_4_]);
      if (BVar2 == no) {
        return yes;
      }
    }
  }
  return no;
}

Assistant:

Bool TY_(nodeHasText)( TidyDocImpl* doc, Node* node )
{
  if ( doc && node )
  {
    uint ix;
    Lexer* lexer = doc->lexer;
    for ( ix = node->start; ix < node->end; ++ix )
    {
        /* whitespace */
        if ( !TY_(IsWhite)( lexer->lexbuf[ix] ) )
            return yes;
    }
  }
  return no;
}